

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O3

_Bool multi_handle_timeout
                (Curl_easy *data,curltime *now,_Bool *stream_error,CURLcode *result,
                _Bool connect_timeout)

{
  curltime *pcVar1;
  long lVar2;
  curl_off_t cVar3;
  undefined8 uVar4;
  undefined4 uVar5;
  undefined8 uVar6;
  undefined4 uVar7;
  undefined8 uVar8;
  undefined4 uVar9;
  undefined8 uVar10;
  undefined4 uVar11;
  undefined8 uVar12;
  undefined4 uVar13;
  undefined8 uVar14;
  undefined4 uVar15;
  timediff_t tVar16;
  timediff_t tVar17;
  CURLcode status;
  char *fmt;
  curltime newer;
  curltime newer_00;
  curltime newer_01;
  curltime older;
  curltime older_00;
  curltime older_01;
  
  tVar16 = Curl_timeleft(data,now,false);
  if (-1 < tVar16) goto LAB_001449cd;
  pcVar1 = &(data->progress).t_startop;
  uVar14 = pcVar1->tv_sec;
  uVar15 = pcVar1->tv_usec;
  older_01.tv_usec = uVar15;
  older_01.tv_sec = uVar14;
  uVar10 = pcVar1->tv_sec;
  uVar11 = pcVar1->tv_usec;
  older_00.tv_usec = uVar11;
  older_00.tv_sec = uVar10;
  uVar6 = pcVar1->tv_sec;
  uVar7 = pcVar1->tv_usec;
  older.tv_usec = uVar7;
  older.tv_sec = uVar6;
  if (data->mstate == MSTATE_CONNECTING) {
    uVar8 = now->tv_sec;
    uVar9 = now->tv_usec;
    newer_00.tv_usec = uVar9;
    newer_00.tv_sec = uVar8;
    newer_00._12_4_ = 0;
    older_00._12_4_ = 0;
    tVar17 = Curl_timediff(newer_00,older_00);
    fmt = "Connection timed out after %ld milliseconds";
LAB_00144931:
    Curl_failf(data,fmt,tVar17);
  }
  else {
    if (data->mstate == MSTATE_RESOLVING) {
      uVar4 = now->tv_sec;
      uVar5 = now->tv_usec;
      newer.tv_usec = uVar5;
      newer.tv_sec = uVar4;
      newer._12_4_ = 0;
      older._12_4_ = 0;
      tVar17 = Curl_timediff(newer,older);
      fmt = "Resolving timed out after %ld milliseconds";
      goto LAB_00144931;
    }
    lVar2 = (data->req).size;
    uVar12 = now->tv_sec;
    uVar13 = now->tv_usec;
    newer_01.tv_usec = uVar13;
    newer_01.tv_sec = uVar12;
    newer_01._12_4_ = 0;
    older_01._12_4_ = 0;
    tVar17 = Curl_timediff(newer_01,older_01);
    cVar3 = (data->req).bytecount;
    if (lVar2 == -1) {
      Curl_failf(data,"Operation timed out after %ld milliseconds with %ld bytes received",tVar17,
                 cVar3);
    }
    else {
      Curl_failf(data,
                 "Operation timed out after %ld milliseconds with %ld out of %ld bytes received",
                 tVar17,cVar3,(data->req).size);
    }
  }
  *result = CURLE_OPERATION_TIMEDOUT;
  if (data->conn != (connectdata *)0x0) {
    status = CURLE_OPERATION_TIMEDOUT;
    if (MSTATE_DO < data->mstate) {
      Curl_conncontrol(data->conn,2);
      *stream_error = true;
      status = *result;
    }
    multi_done(data,status,true);
  }
LAB_001449cd:
  return SUB81((ulong)tVar16 >> 0x3f,0);
}

Assistant:

static bool multi_handle_timeout(struct Curl_easy *data,
                                 struct curltime *now,
                                 bool *stream_error,
                                 CURLcode *result,
                                 bool connect_timeout)
{
  timediff_t timeout_ms = Curl_timeleft(data, now, connect_timeout);
  if(timeout_ms < 0) {
    /* Handle timed out */
    struct curltime since;
    if(connect_timeout)
      since = data->progress.t_startsingle;
    else
      since = data->progress.t_startop;
    if(data->mstate == MSTATE_RESOLVING)
      failf(data, "Resolving timed out after %" FMT_TIMEDIFF_T
            " milliseconds", Curl_timediff(*now, since));
    else if(data->mstate == MSTATE_CONNECTING)
      failf(data, "Connection timed out after %" FMT_TIMEDIFF_T
            " milliseconds", Curl_timediff(*now, since));
    else {
      struct SingleRequest *k = &data->req;
      if(k->size != -1) {
        failf(data, "Operation timed out after %" FMT_TIMEDIFF_T
              " milliseconds with %" FMT_OFF_T " out of %"
              FMT_OFF_T " bytes received",
              Curl_timediff(*now, since), k->bytecount, k->size);
      }
      else {
        failf(data, "Operation timed out after %" FMT_TIMEDIFF_T
              " milliseconds with %" FMT_OFF_T " bytes received",
              Curl_timediff(*now, since), k->bytecount);
      }
    }
    *result = CURLE_OPERATION_TIMEDOUT;
    if(data->conn) {
      /* Force connection closed if the connection has indeed been used */
      if(data->mstate > MSTATE_DO) {
        streamclose(data->conn, "Disconnect due to timeout");
        *stream_error = TRUE;
      }
      (void)multi_done(data, *result, TRUE);
    }
    return TRUE;
  }

  return FALSE;
}